

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

bool __thiscall ElfFile::getSymbol(ElfFile *this,Elf32_Sym *symbol,size_t index)

{
  Endianness endianness_00;
  Elf32_Word EVar1;
  Elf32_Addr EVar2;
  int iVar3;
  ByteArray *this_00;
  size_t pos_00;
  byte *pbVar4;
  bool bVar5;
  Endianness endianness;
  size_t pos;
  ByteArray *data;
  size_t index_local;
  Elf32_Sym *symbol_local;
  ElfFile *this_local;
  
  bVar5 = this->symTab != (ElfSection *)0x0;
  if (bVar5) {
    this_00 = ElfSection::getData(this->symTab);
    pos_00 = index * 0x10;
    endianness_00 = getEndianness(this);
    EVar1 = ByteArray::getDoubleWord(this_00,pos_00,endianness_00);
    symbol->st_name = EVar1;
    EVar2 = ByteArray::getDoubleWord(this_00,pos_00 + 4,endianness_00);
    symbol->st_value = EVar2;
    EVar1 = ByteArray::getDoubleWord(this_00,pos_00 + 8,endianness_00);
    symbol->st_size = EVar1;
    pbVar4 = ByteArray::operator[](this_00,pos_00 + 0xc);
    symbol->st_info = *pbVar4;
    pbVar4 = ByteArray::operator[](this_00,pos_00 + 0xd);
    symbol->st_other = *pbVar4;
    iVar3 = ByteArray::getWord(this_00,pos_00 + 0xe,endianness_00);
    symbol->st_shndx = (Elf32_Half)iVar3;
  }
  return bVar5;
}

Assistant:

bool ElfFile::getSymbol(Elf32_Sym& symbol, size_t index)
{
	if (symTab == nullptr)
		return false;

	ByteArray &data = symTab->getData();
	size_t pos = index*sizeof(Elf32_Sym);
	Endianness endianness = getEndianness();
	symbol.st_name  = data.getDoubleWord(pos + 0x00, endianness);
	symbol.st_value = data.getDoubleWord(pos + 0x04, endianness);
	symbol.st_size  = data.getDoubleWord(pos + 0x08, endianness);
	symbol.st_info  = data[pos + 0x0C];
	symbol.st_other = data[pos + 0x0D];
	symbol.st_shndx = data.getWord(pos + 0x0E, endianness);

	return true;
}